

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_columnref_expression.cpp
# Opt level: O1

void __thiscall
duckdb::BoundColumnRefExpression::BoundColumnRefExpression
          (BoundColumnRefExpression *this,LogicalType *type,ColumnBinding binding,idx_t depth)

{
  LogicalType LStack_68;
  string local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  LogicalType::LogicalType(&LStack_68,type);
  BoundColumnRefExpression(this,&local_50,&LStack_68,binding,depth);
  LogicalType::~LogicalType(&LStack_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

BoundColumnRefExpression::BoundColumnRefExpression(LogicalType type, ColumnBinding binding, idx_t depth)
    : BoundColumnRefExpression(string(), std::move(type), binding, depth) {
}